

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O0

string * XmlRpc::XmlRpcUtil::xmlDecode(string *encoded)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  string *in_RSI;
  string *in_RDI;
  int iEntity;
  char *ens;
  size_type iSize;
  size_type iAmp;
  string *decoded;
  int local_44;
  ulong local_18;
  
  local_18 = std::__cxx11::string::find((char)in_RSI,0x26);
  if (local_18 == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,in_RSI,0,local_18);
    uVar2 = std::__cxx11::string::size();
    std::__cxx11::string::reserve((ulong)in_RDI);
    lVar3 = std::__cxx11::string::c_str();
    while (local_18 != uVar2) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
      if ((*pcVar4 == '&') && (local_18 + 1 < uVar2)) {
        for (local_44 = 0; xmlEntity[local_44] != (char *)0x0; local_44 = local_44 + 1) {
          iVar1 = strncmp((char *)(lVar3 + local_18 + 1),xmlEntity[local_44],
                          (long)xmlEntLen[local_44]);
          if (iVar1 == 0) {
            std::__cxx11::string::operator+=((string *)in_RDI,"<>&\'\""[local_44]);
            local_18 = (long)(xmlEntLen[local_44] + 1) + local_18;
            break;
          }
        }
        if (xmlEntity[local_44] == (char *)0x0) {
          local_18 = local_18 + 1;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
          std::__cxx11::string::operator+=((string *)in_RDI,*pcVar4);
        }
      }
      else {
        local_18 = local_18 + 1;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
        std::__cxx11::string::operator+=((string *)in_RDI,*pcVar4);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string 
XmlRpcUtil::xmlDecode(const std::string& encoded)
{
  std::string::size_type iAmp = encoded.find(AMP);
  if (iAmp == std::string::npos)
    return encoded;

  std::string decoded(encoded, 0, iAmp);
  std::string::size_type iSize = encoded.size();
  decoded.reserve(iSize);

  const char* ens = encoded.c_str();
  while (iAmp != iSize) {
    if (encoded[iAmp] == AMP && iAmp+1 < iSize) {
      int iEntity;
      for (iEntity=0; xmlEntity[iEntity] != 0; ++iEntity)
	//if (encoded.compare(iAmp+1, xmlEntLen[iEntity], xmlEntity[iEntity]) == 0)
	if (strncmp(ens+iAmp+1, xmlEntity[iEntity], xmlEntLen[iEntity]) == 0)
        {
          decoded += rawEntity[iEntity];
          iAmp += xmlEntLen[iEntity]+1;
          break;
        }
      if (xmlEntity[iEntity] == 0)    // unrecognized sequence
        decoded += encoded[iAmp++];

    } else {
      decoded += encoded[iAmp++];
    }
  }
    
  return decoded;
}